

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O2

void __thiscall flowtest::Lexer::skipSpace(Lexer *this)

{
  char cVar1;
  ulong uVar2;
  
  while ((uVar2 = (ulong)(this->currentPos_).offset, (this->source_)._M_string_length != uVar2 &&
         ((cVar1 = (this->source_)._M_dataplus._M_p[uVar2], cVar1 == ' ' || (cVar1 == '\t'))))) {
    nextChar(this,1);
  }
  return;
}

Assistant:

void Lexer::skipSpace() {
  for (;;) {
    switch (currentChar()) {
      case ' ':
      case '\t':
        nextChar();
        break;
      default:
        return;
    }
  }
}